

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Condition.cpp
# Opt level: O2

bool __thiscall Condition::Wait(Condition *this,Mutex *mutex,uint32_t timeoutms)

{
  int iVar1;
  timespec timeout;
  timespec local_30;
  
  if (timeoutms == 0) {
    pthread_cond_wait((pthread_cond_t *)this,(pthread_mutex_t *)mutex);
  }
  else {
    TimeUtils::getCurTime(&local_30);
    TimeUtils::addOffset(&local_30,timeoutms);
    iVar1 = pthread_cond_timedwait
                      ((pthread_cond_t *)this,(pthread_mutex_t *)mutex,(timespec *)&local_30);
    if (iVar1 != 0) {
      return false;
    }
  }
  return true;
}

Assistant:

bool Condition::Wait( Mutex &mutex, uint32_t timeoutms )
{
	if ( timeoutms > 0 )
	{
		struct timespec timeout;
		TimeUtils::getCurTime( &timeout );
		TimeUtils::addOffset( &timeout, timeoutms );
		if ( pthread_cond_timedwait( &mCond, &mutex.mMutex, &timeout ) != 0 )
			return false;
	}
	else
		Wait( mutex );
	
	return true;
}